

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall hwnet::util::TimerRoutine::Stop(TimerRoutine *this)

{
  mutex *__mutex;
  
  __mutex = &(this->mgr).mtx;
  std::mutex::lock(__mutex);
  if (((this->stoped)._M_base._M_i & 1U) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  LOCK();
  (this->stoped)._M_base._M_i = true;
  UNLOCK();
  if (this->waitting == true) {
    std::_V2::condition_variable_any::notify_one(&this->cv);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::thread::join();
  return;
}

Assistant:

void TimerRoutine::Stop() {
	this->mgr.mtx.lock();
	if(this->stoped){
		this->mgr.mtx.unlock();
		return;
	}
	this->stoped = true;
	if(this->waitting) {
		this->cv.notify_one();
	}
	this->mgr.mtx.unlock();
	this->thd.join();
}